

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O1

size_t __thiscall ON_SubDHeap::SizeOfActivePoolElements(ON_SubDHeap *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  
  sVar1 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fspv);
  sVar2 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fspe);
  sVar3 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fspf);
  sVar4 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fsp5);
  sVar5 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fsp9);
  sVar6 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fsp17);
  sVar7 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fsp_full_fragments);
  sVar8 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fsp_part_fragments);
  sVar9 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fsp_oddball_fragments);
  sVar10 = ON_FixedSizePool::SizeOfActiveElements(&this->m_fsp_limit_curves);
  return sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + sVar1;
}

Assistant:

size_t SizeOfActivePoolElements() const
  {
    size_t sz = 0;
    sz += m_fspv.SizeOfActiveElements();
    sz += m_fspe.SizeOfActiveElements();
    sz += m_fspf.SizeOfActiveElements();
    sz += m_fsp5.SizeOfActiveElements();
    sz += m_fsp9.SizeOfActiveElements();
    sz += m_fsp17.SizeOfActiveElements();
    sz += m_fsp_full_fragments.SizeOfActiveElements();
    sz += m_fsp_part_fragments.SizeOfActiveElements();
    sz += m_fsp_oddball_fragments.SizeOfActiveElements();
    sz += m_fsp_limit_curves.SizeOfActiveElements();
    return sz;
  }